

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::AssignActiveReg(LinearScan *this,Lifetime *lifetime,RegNum reg)

{
  code *pcVar1;
  BOOLEAN BVar2;
  bool bVar3;
  undefined4 *puVar4;
  BVIndex index;
  undefined7 in_register_00000011;
  
  index = (BVIndex)CONCAT71(in_register_00000011,reg);
  BVar2 = BVUnitT<unsigned_long>::Test(&this->activeRegs,index);
  if (BVar2 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe46,"(!this->activeRegs.Test(reg))","!this->activeRegs.Test(reg)");
    if (!bVar3) goto LAB_00531b7f;
    *puVar4 = 0;
  }
  if ((lifetime->field_0x9c & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe47,"(!lifetime->isSpilled)","!lifetime->isSpilled");
    if (!bVar3) goto LAB_00531b7f;
    *puVar4 = 0;
  }
  if (lifetime->reg != reg && lifetime->reg != RegNOREG) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe48,"(lifetime->reg == RegNOREG || lifetime->reg == reg)",
                       "lifetime->reg == RegNOREG || lifetime->reg == reg");
    if (!bVar3) {
LAB_00531b7f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  BVUnitT<unsigned_long>::Set(&this->func->m_regsUsed,index);
  lifetime->reg = reg;
  BVUnitT<unsigned_long>::Set(&this->activeRegs,index);
  if ((lifetime->field_0x9d & 0x20) == 0) {
    this->intRegUsedCount = this->intRegUsedCount + 1;
  }
  else {
    this->floatRegUsedCount = this->floatRegUsedCount + 1;
  }
  AddToActive(this,lifetime);
  BVUnitT<unsigned_long>::Clear(&this->tempRegs,index);
  return;
}

Assistant:

void
LinearScan::AssignActiveReg(Lifetime * lifetime, RegNum reg)
{
    Assert(!this->activeRegs.Test(reg));
    Assert(!lifetime->isSpilled);
    Assert(lifetime->reg == RegNOREG || lifetime->reg == reg);
    this->func->m_regsUsed.Set(reg);
    lifetime->reg = reg;
    this->activeRegs.Set(reg);
    if (lifetime->IsInt())
    {
        this->intRegUsedCount++;
    }
    else
    {
        this->floatRegUsedCount++;
    }
    this->AddToActive(lifetime);

    this->tempRegs.Clear(reg);
}